

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O2

void __thiscall
Inter_Symbol_Generator::matrix_copy_to
          (Inter_Symbol_Generator *this,uint8_t **src,uint32_t row,uint32_t col,uint8_t **dst,
          uint32_t r_pos,uint32_t c_pos)

{
  long lVar1;
  uint32_t uVar2;
  
  for (uVar2 = r_pos; uVar2 < row + r_pos; uVar2 = uVar2 + 1) {
    for (lVar1 = 0; (ulong)c_pos + lVar1 < (ulong)(col + c_pos); lVar1 = lVar1 + 1) {
      dst[uVar2][lVar1 + (ulong)c_pos] = src[uVar2 - r_pos][lVar1];
    }
  }
  return;
}

Assistant:

void Inter_Symbol_Generator::matrix_copy_to(uint8_t **src, uint32_t row, uint32_t col, uint8_t **dst, uint32_t r_pos, uint32_t c_pos)
{
	uint32_t i = 0;
	uint32_t j = 0;

	for (i = r_pos; i < r_pos + row; i++)
	{
		for (j = c_pos; j < c_pos + col; j++)
		{
			dst[i][j] = src[i - r_pos][j - c_pos];
			//std::cout << i << " " << j << std::endl;
		}
	}
}